

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testAll(void)

{
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> timer;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  string local_78;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> local_58;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"LKH",&local_99);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"milliseconds",&local_9a);
  helptool::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
            (&local_58,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  testDoOpt();
  helptool::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&local_58);
  return;
}

Assistant:

void testAll()
{
    // testDataReader();
    // testInitTSP();
    // testDoOpt();
#ifdef NO_TEST
    EdgeTest e_test;
    e_test.test();
    TourTest tour_test;
    tour_test.test();
    TSPTest tsp_test;
    tsp_test.test();
#endif
    helptool::Timer<std::chrono::milliseconds> timer("LKH", "milliseconds");
    testDoOpt();
}